

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *__dest;
  char *pcVar8;
  char *__s;
  
  sVar5 = strlen(nextarg);
  if (sVar5 == 0) {
LAB_001129df:
    pcVar6 = (char *)0x0;
  }
  else {
    iVar4 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar4 == 0) && (pcVar6 = strpbrk(nextarg,":\\"), pcVar6 != (char *)0x0)) {
      pcVar6 = (char *)malloc(sVar5 + 1);
      if (pcVar6 != (char *)0x0) {
        pcVar7 = (char *)0x0;
        __s = nextarg;
        __dest = pcVar6;
LAB_0011294f:
        do {
          pcVar8 = __dest;
          if (*__s == '\0') goto LAB_00112a2d;
          sVar5 = strcspn(__s,":\\");
          strncpy(__dest,__s,sVar5);
          pcVar1 = __s + sVar5;
          pcVar8 = __dest + sVar5;
          pcVar2 = __s + sVar5;
          if (*pcVar2 == '\\') {
            cVar3 = pcVar1[1];
            __dest = pcVar8 + 1;
            if (cVar3 == '\\') {
              *pcVar8 = '\\';
            }
            else {
              if (cVar3 != ':') {
                if (cVar3 == '\0') {
                  __s = pcVar1 + 1;
                  *pcVar8 = '\\';
                }
                else {
                  *pcVar8 = '\\';
                  pcVar8[1] = cVar3;
                  __s = pcVar1 + 2;
                  __dest = pcVar8 + 2;
                }
                goto LAB_0011294f;
              }
              *pcVar8 = ':';
            }
            __s = pcVar1 + 2;
            goto LAB_0011294f;
          }
          __s = pcVar1;
          __dest = pcVar8;
        } while (*pcVar2 != ':');
        if (pcVar1[1] == '\0') {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar1 + 1);
        }
LAB_00112a2d:
        *pcVar8 = '\0';
        goto LAB_001129e4;
      }
      goto LAB_001129df;
    }
    pcVar6 = strdup(nextarg);
  }
  pcVar7 = (char *)0x0;
LAB_001129e4:
  free(*file);
  *file = pcVar6;
  if (pcVar7 != (char *)0x0) {
    free(*password);
    *password = pcVar7;
  }
  cleanarg(nextarg);
  return;
}

Assistant:

static void
GetFileAndPassword(char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  parse_cert_parameter(nextarg, &certname, &passphrase);
  Curl_safefree(*file);
  *file = certname;
  if(passphrase) {
    Curl_safefree(*password);
    *password = passphrase;
  }
  cleanarg(nextarg);
}